

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# receive.cpp
# Opt level: O0

CAmount wallet::TxGetCredit(CWallet *wallet,CTransaction *tx,isminefilter *filter)

{
  bool bVar1;
  reference filter_00;
  CAmount CVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  CWallet *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  long in_FS_OFFSET;
  CTxOut *txout;
  vector<CTxOut,_std::allocator<CTxOut>_> *__range1;
  const_iterator __end1;
  const_iterator __begin1;
  CAmount nCredit;
  __normal_iterator<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_>
  *in_stack_ffffffffffffff38;
  vector<CTxOut,_std::allocator<CTxOut>_> *in_stack_ffffffffffffff40;
  __normal_iterator<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_>
  *in_stack_ffffffffffffff48;
  CTxOut *txout_00;
  long local_50;
  string local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_50 = 0;
  txout_00 = (CTxOut *)((long)&in_RSI->field_2 + 8);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::begin(in_stack_ffffffffffffff40);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::end(in_stack_ffffffffffffff40);
  do {
    bVar1 = __gnu_cxx::operator==<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_>
                      (in_stack_ffffffffffffff48,
                       (__normal_iterator<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_>
                        *)in_stack_ffffffffffffff40);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        return local_50;
      }
LAB_009c0360:
      __stack_chk_fail();
    }
    filter_00 = __gnu_cxx::
                __normal_iterator<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_>::
                operator*(in_stack_ffffffffffffff38);
    CVar2 = OutputGetCredit(in_RDX,txout_00,(isminefilter *)filter_00);
    local_50 = CVar2 + local_50;
    bVar1 = MoneyRange((CAmount *)in_stack_ffffffffffffff38);
    if (!bVar1) {
      __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              __cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_RSI,(char *)in_RDX,(allocator<char> *)txout_00);
      std::operator+(__lhs,(char *)in_stack_ffffffffffffff48);
      std::runtime_error::runtime_error((runtime_error *)__lhs,local_28);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        __cxa_throw(__lhs,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_009c0360;
    }
    __gnu_cxx::__normal_iterator<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_>::
    operator++(in_stack_ffffffffffffff38);
  } while( true );
}

Assistant:

CAmount TxGetCredit(const CWallet& wallet, const CTransaction& tx, const isminefilter& filter)
{
    CAmount nCredit = 0;
    for (const CTxOut& txout : tx.vout)
    {
        nCredit += OutputGetCredit(wallet, txout, filter);
        if (!MoneyRange(nCredit))
            throw std::runtime_error(std::string(__func__) + ": value out of range");
    }
    return nCredit;
}